

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O2

bool __thiscall Assimp::TriangulateProcess::TriangulateMesh(TriangulateProcess *this,aiMesh *pMesh)

{
  uint **ppuVar1;
  aiFace *paVar2;
  aiVector2t<float> *p2;
  aiVector2t<float> *p1;
  float fVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong *puVar9;
  aiFace *paVar10;
  uint *puVar11;
  uint *puVar12;
  Logger *this_00;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  aiFace *f;
  aiVector3D *paVar17;
  aiVector3D *paVar18;
  char *pcVar19;
  aiVector2t<float> *p0;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  aiVector3t<float> *v2;
  aiFace *paVar25;
  uint uVar26;
  bool bVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  aiVector3t<float> aVar31;
  undefined1 local_108 [24];
  unique_ptr<bool[],_std::default_delete<bool[]>_> done;
  aiFace *local_e8;
  aiVector3t<float> local_d0;
  int local_c0;
  uint local_bc;
  aiMesh *local_b8;
  aiVector2t<float> *local_b0;
  aiFace *local_a8;
  aiFace *local_a0;
  ulong local_98;
  aiVector3t<float> local_90;
  int local_80;
  uint local_7c;
  aiVector3D *local_78;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> temp_verts;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp_verts3d;
  
  uVar26 = pMesh->mPrimitiveTypes;
  if (uVar26 == 0) {
    uVar23 = pMesh->mNumFaces;
    uVar14 = (ulong)uVar23;
    bVar27 = false;
    for (lVar20 = 0; uVar14 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
      bVar27 = (bool)(bVar27 | *(int *)((long)&pMesh->mFaces->mNumIndices + lVar20) != 3);
    }
    if (!bVar27) {
      return false;
    }
  }
  else {
    if ((uVar26 & 8) == 0) {
      return false;
    }
    uVar23 = pMesh->mNumFaces;
    uVar14 = (ulong)uVar23;
  }
  uVar24 = 0;
  uVar13 = 0;
  for (lVar20 = 0; uVar14 * 0x10 != lVar20; lVar20 = lVar20 + 0x10) {
    uVar5 = *(uint *)((long)&pMesh->mFaces->mNumIndices + lVar20);
    if (uVar5 < 4) {
      uVar24 = uVar24 + 1;
      uVar16 = uVar13;
    }
    else {
      uVar24 = (uVar24 + uVar5) - 2;
      uVar16 = (ulong)uVar5;
      if (uVar5 < (uint)uVar13) {
        uVar16 = uVar13;
      }
    }
    uVar13 = uVar16;
  }
  if (uVar24 == uVar23) {
    __assert_fail("numOut != pMesh->mNumFaces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/TriangulateProcess.cpp"
                  ,0xa2,"bool Assimp::TriangulateProcess::TriangulateMesh(aiMesh *)");
  }
  pMesh->mPrimitiveTypes = uVar26 & 0xfffffff3 | 4;
  uVar14 = (ulong)uVar24;
  puVar9 = (ulong *)operator_new__(uVar14 * 0x10 + 8);
  *puVar9 = uVar14;
  local_a8 = (aiFace *)(puVar9 + 1);
  if (uVar24 != 0) {
    paVar10 = local_a8;
    do {
      paVar10->mNumIndices = 0;
      paVar10->mIndices = (uint *)0x0;
      paVar10 = paVar10 + 1;
    } while (paVar10 != local_a8 + uVar14);
  }
  uVar14 = (ulong)((uint)uVar13 + 2);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&temp_verts3d,uVar14,(allocator_type *)&temp_verts);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
            (&temp_verts,uVar14,(allocator_type *)local_108);
  paVar17 = pMesh->mVertices;
  done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
                 operator_new__(uVar13);
  uVar14 = 0;
  local_b8 = pMesh;
  local_78 = paVar17;
  paVar10 = local_a8;
  do {
    paVar25 = pMesh->mFaces;
    if (pMesh->mNumFaces <= uVar14) {
      if (paVar25 != (aiFace *)0x0) {
        puVar11 = paVar25[-1].mIndices;
        if (puVar11 != (uint *)0x0) {
          lVar20 = (long)puVar11 << 4;
          do {
            aiFace::~aiFace((aiFace *)((long)&paVar25[-1].mNumIndices + lVar20));
            lVar20 = lVar20 + -0x10;
          } while (lVar20 != 0);
        }
        operator_delete__(&paVar25[-1].mIndices,(long)puVar11 << 4 | 8);
      }
      pMesh->mFaces = local_a8;
      pMesh->mNumFaces = (uint)((ulong)((long)paVar10 - (long)local_a8) >> 4);
      std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr(&done);
      std::_Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~_Vector_base
                (&temp_verts.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&temp_verts3d.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      return true;
    }
    local_98 = uVar14;
    paVar2 = paVar25 + uVar14;
    uVar26 = paVar25[uVar14].mNumIndices;
    uVar13 = (ulong)uVar26;
    if (uVar13 < 4) {
      local_e8 = paVar10 + 1;
      paVar10->mNumIndices = uVar26;
      paVar10->mIndices = paVar2->mIndices;
      paVar2->mIndices = (uint *)0x0;
    }
    else {
      if (uVar26 != 4) {
        puVar11 = paVar25[uVar14].mIndices;
        uVar14 = 0;
        if (0 < (int)uVar26) {
          uVar14 = (ulong)uVar26;
        }
        uVar23 = uVar26 - 1;
        puVar12 = puVar11;
        for (lVar20 = 0; uVar14 * 3 != lVar20; lVar20 = lVar20 + 3) {
          uVar24 = *puVar12;
          (&(temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->z)[lVar20] = paVar17[uVar24].z;
          *(undefined8 *)
           (&(temp_verts3d.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start)->x + lVar20) = *(undefined8 *)(paVar17 + uVar24);
          puVar12 = puVar12 + 1;
        }
        local_108._0_8_ = 0;
        local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
        NewellNormal<3,3,3,float>
                  ((aiVector3t<float> *)local_108,uVar26,
                   &(temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x,
                   &(temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->y,
                   &(temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->z);
        uVar16 = (ulong)local_108._0_8_ >> 0x20;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_108._0_8_;
        auVar30._8_4_ = 0x80000000;
        auVar30._0_8_ = local_108._0_8_ ^ 0x8000000080000000;
        auVar30._12_4_ = 0x80000000;
        auVar30 = maxps(auVar29,auVar30);
        fVar28 = (float)local_108._8_4_;
        if ((float)local_108._8_4_ <= -(float)local_108._8_4_) {
          fVar28 = -(float)local_108._8_4_;
        }
        if (auVar30._0_4_ <= auVar30._4_4_) {
          if (auVar30._4_4_ <= fVar28) goto LAB_003bd76c;
          iVar7 = 0;
          iVar15 = 2;
        }
        else {
          if (auVar30._0_4_ <= fVar28) {
LAB_003bd76c:
            iVar15 = 0;
            iVar7 = 1;
            fVar28 = (float)local_108._8_4_;
            goto LAB_003bd771;
          }
          iVar15 = 1;
          iVar7 = 2;
          uVar16 = local_108._0_8_;
        }
        fVar28 = (float)uVar16;
LAB_003bd771:
        iVar8 = iVar7;
        if (fVar28 < 0.0) {
          iVar8 = iVar15;
          iVar15 = iVar7;
        }
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          paVar18 = paVar17 + puVar11[uVar16];
          if (iVar15 == 2) {
            paVar18 = (aiVector3D *)&paVar18->z;
          }
          else if (iVar15 == 1) {
            paVar18 = (aiVector3D *)&paVar18->y;
          }
          temp_verts.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar16].x = paVar18->x;
          paVar18 = paVar17 + puVar11[uVar16];
          if (iVar8 == 2) {
            paVar18 = (aiVector3D *)&paVar18->z;
          }
          else if (iVar8 == 1) {
            paVar18 = (aiVector3D *)&paVar18->y;
          }
          temp_verts.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar16].y = paVar18->x;
          *(undefined1 *)
           ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                  super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar16) = 0;
        }
        local_a0 = paVar2;
        uVar24 = 0;
        uVar14 = uVar13;
        local_e8 = paVar10;
LAB_003bd814:
        paVar25 = local_a0;
        pMesh = local_b8;
        if (3 < (int)uVar14) {
          local_c0 = 0;
          local_80 = (int)uVar14;
          uVar5 = uVar24;
LAB_003bd840:
          while( true ) {
            do {
              uVar22 = uVar5;
              uVar24 = uVar24 + 1;
              if ((int)uVar26 <= (int)uVar24) {
                uVar24 = 0;
              }
              uVar5 = uVar22;
            } while (*(char *)((long)done._M_t.
                                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                     super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                              (long)(int)uVar24) != '\0');
            if (((int)uVar24 < (int)uVar22) && (bVar27 = local_c0 == 1, local_c0 = 1, bVar27))
            break;
            p2 = temp_verts.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar22;
            local_b0 = temp_verts.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + (int)uVar23;
            p1 = temp_verts.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar24;
            local_7c = uVar23;
            bVar27 = OnLeftSideOfLine2D<aiVector2t<float>>(local_b0,p1,p2);
            local_bc = uVar22;
            uVar5 = uVar24;
            uVar23 = uVar22;
            if (!bVar27) {
              lVar20 = 0;
              p0 = local_b0;
              uVar14 = uVar13;
              do {
                if (uVar14 == 0) goto LAB_003bd933;
                fVar28 = *(float *)((long)&(temp_verts.
                                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->x + lVar20);
                fVar3 = *(float *)((long)&(temp_verts.
                                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->y + lVar20);
                if ((fVar28 != p2->x) || (NAN(fVar28) || NAN(p2->x))) {
LAB_003bd8ea:
                  if ((fVar28 == p1->x) && (!NAN(fVar28) && !NAN(p1->x))) {
                    if ((fVar3 == p1->y) && (!NAN(fVar3) && !NAN(p1->y))) goto LAB_003bd920;
                  }
                  if ((fVar28 == p0->x) && (!NAN(fVar28) && !NAN(p0->x))) {
                    if ((fVar3 == p0->y) && (!NAN(fVar3) && !NAN(p0->y))) goto LAB_003bd920;
                  }
                  bVar27 = PointInTriangle2D<aiVector2t<float>>
                                     (p0,p2,p1,(aiVector2t<float> *)
                                               ((long)&(temp_verts.
                                                                                                                
                                                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->x +
                                               lVar20));
                  p0 = local_b0;
                  if (bVar27) goto LAB_003bd926;
                }
                else if ((fVar3 != p2->y) || (NAN(fVar3) || NAN(p2->y))) goto LAB_003bd8ea;
LAB_003bd920:
                lVar20 = lVar20 + 8;
                uVar14 = uVar14 - 1;
              } while( true );
            }
          }
          this_00 = DefaultLogger::get();
          paVar17 = local_78;
          paVar25 = local_a0;
          pMesh = local_b8;
          Logger::error(this_00,
                        "Failed to triangulate polygon (no ear found). Probably not a simple polygon?"
                       );
          goto LAB_003bdac5;
        }
        if (0 < (int)uVar26) {
          local_e8->mNumIndices = 3;
          puVar12 = local_e8->mIndices;
          if (puVar12 == (uint *)0x0) {
            puVar12 = (uint *)operator_new__(0xc);
            local_e8->mIndices = puVar12;
          }
          lVar20 = -1;
          lVar6 = 2;
          uVar14 = 1;
          do {
            uVar13 = uVar14;
            lVar21 = lVar6;
            pcVar19 = (char *)((long)done._M_t.
                                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                     super__Head_base<0UL,_bool_*,_false>._M_head_impl + 1 + lVar20)
            ;
            lVar20 = lVar20 + 1;
            lVar6 = lVar21 + 1;
            uVar14 = uVar13 + 1;
          } while (*pcVar19 != '\0');
          *puVar12 = (uint)lVar20;
          do {
            lVar20 = lVar21;
            uVar14 = uVar13;
            uVar13 = uVar14 + 1;
            lVar21 = lVar20 + 1;
          } while (*(char *)((long)done._M_t.
                                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                   super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar14) !=
                   '\0');
          local_e8->mIndices[1] = (int)(uVar14 + 1) - 1;
          pcVar19 = (char *)(lVar20 + (long)done._M_t.
                                            super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>
                                            .super__Head_base<0UL,_bool_*,_false>._M_head_impl);
          do {
            uVar26 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar26;
            cVar4 = *pcVar19;
            pcVar19 = pcVar19 + 1;
          } while (cVar4 != '\0');
          local_e8->mIndices[2] = uVar26;
          local_e8 = local_e8 + 1;
        }
LAB_003bdac5:
        for (; paVar10 != local_e8; paVar10 = paVar10 + 1) {
          puVar12 = paVar10->mIndices;
          *puVar12 = puVar11[*puVar12];
          puVar12[1] = puVar11[puVar12[1]];
          puVar12[2] = puVar11[puVar12[2]];
        }
        if (paVar25->mIndices != (uint *)0x0) {
          operator_delete__(paVar25->mIndices);
        }
        paVar25->mIndices = (uint *)0x0;
        goto LAB_003bdae2;
      }
      uVar14 = 0;
      do {
        puVar9 = (ulong *)paVar2->mIndices;
        if (uVar14 == 4) {
          uVar26 = 0;
          goto LAB_003bd6d0;
        }
        uVar26 = *(uint *)((long)puVar9 + (uVar14 ^ 2) * 4);
        uVar23 = *(uint *)((long)puVar9 + (ulong)((int)uVar14 + 1U & 3) * 4);
        v2 = paVar17 + *(uint *)((long)puVar9 + uVar14 * 4);
        aVar31 = operator-(paVar17 + *(uint *)((long)puVar9 + (ulong)((int)uVar14 - 1U & 3) * 4),v2)
        ;
        local_108._0_8_ = aVar31._0_8_;
        local_108._8_4_ = aVar31.z;
        aVar31 = operator-(paVar17 + uVar26,v2);
        local_d0.z = aVar31.z;
        local_d0._0_8_ = aVar31._0_8_;
        aVar31 = operator-(paVar17 + uVar23,v2);
        local_90.z = aVar31.z;
        local_90._0_8_ = aVar31._0_8_;
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_108);
        aiVector3t<float>::Normalize(&local_d0);
        aiVector3t<float>::Normalize(&local_90);
        fVar28 = acosf((float)local_108._8_4_ * local_d0.z +
                       (float)local_108._0_4_ * local_d0.x + (float)local_108._4_4_ * local_d0.y);
        local_b0 = (aiVector2t<float> *)CONCAT44(local_b0._4_4_,fVar28);
        fVar28 = acosf(local_90.z * local_d0.z + local_90.x * local_d0.x + local_90.y * local_d0.y);
        uVar14 = uVar14 + 1;
      } while (fVar28 + local_b0._0_4_ <= 3.1415927);
      uVar26 = (int)uVar14 - 1;
      puVar9 = (ulong *)paVar2->mIndices;
LAB_003bd6d0:
      local_108._0_8_ = *puVar9;
      local_108._8_8_ = puVar9[1];
      paVar10->mNumIndices = 3;
      puVar11 = paVar2->mIndices;
      paVar10->mIndices = puVar11;
      *puVar11 = *(uint *)(local_108 + (ulong)uVar26 * 4);
      paVar10->mIndices[1] = *(uint *)(local_108 + (ulong)(uVar26 + 1 & 3) * 4);
      paVar10->mIndices[2] = *(uint *)(local_108 + (ulong)(uVar26 ^ 2) * 4);
      paVar10[1].mNumIndices = 3;
      puVar11 = (uint *)operator_new__(0xc);
      local_e8 = paVar10 + 2;
      paVar10[1].mIndices = puVar11;
      *puVar11 = *(uint *)(local_108 + (ulong)uVar26 * 4);
      paVar10[1].mIndices[1] = *(uint *)(local_108 + (ulong)(uVar26 ^ 2) * 4);
      paVar10[1].mIndices[2] = *(uint *)(local_108 + (ulong)(uVar26 - 1 & 3) * 4);
      paVar2->mIndices = (uint *)0x0;
      pMesh = local_b8;
    }
LAB_003bdae2:
    uVar14 = local_98 + 1;
    paVar10 = local_e8;
  } while( true );
LAB_003bd926:
  uVar23 = local_bc;
  if ((int)uVar14 == 0) goto LAB_003bd933;
  goto LAB_003bd840;
LAB_003bd933:
  paVar17 = local_78;
  uVar23 = local_7c;
  iVar15 = local_80;
  local_e8->mNumIndices = 3;
  puVar12 = local_e8->mIndices;
  if (puVar12 == (uint *)0x0) {
    puVar12 = (uint *)operator_new__(0xc);
    local_e8->mIndices = puVar12;
  }
  *puVar12 = uVar23;
  local_e8->mIndices[1] = local_bc;
  ppuVar1 = &local_e8->mIndices;
  local_e8 = local_e8 + 1;
  (*ppuVar1)[2] = uVar24;
  *(undefined1 *)
   ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl + (long)(int)uVar22) = 1;
  uVar14 = (ulong)(iVar15 - 1);
  goto LAB_003bd814;
}

Assistant:

bool TriangulateProcess::TriangulateMesh( aiMesh* pMesh)
{
    // Now we have aiMesh::mPrimitiveTypes, so this is only here for test cases
    if (!pMesh->mPrimitiveTypes)    {
        bool bNeed = false;

        for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
            const aiFace& face = pMesh->mFaces[a];

            if( face.mNumIndices != 3)  {
                bNeed = true;
            }
        }
        if (!bNeed)
            return false;
    }
    else if (!(pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON)) {
        return false;
    }

    // Find out how many output faces we'll get
    unsigned int numOut = 0, max_out = 0;
    bool get_normals = true;
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices <= 4) {
            get_normals = false;
        }
        if( face.mNumIndices <= 3) {
            numOut++;

        }
        else {
            numOut += face.mNumIndices-2;
            max_out = std::max(max_out,face.mNumIndices);
        }
    }

    // Just another check whether aiMesh::mPrimitiveTypes is correct
    ai_assert(numOut != pMesh->mNumFaces);

    aiVector3D* nor_out = NULL;

    // if we don't have normals yet, but expect them to be a cheap side
    // product of triangulation anyway, allocate storage for them.
    if (!pMesh->mNormals && get_normals) {
        // XXX need a mechanism to inform the GenVertexNormals process to treat these normals as preprocessed per-face normals
    //  nor_out = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    }

    // the output mesh will contain triangles, but no polys anymore
    pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
    pMesh->mPrimitiveTypes &= ~aiPrimitiveType_POLYGON;

    aiFace* out = new aiFace[numOut](), *curOut = out;
    std::vector<aiVector3D> temp_verts3d(max_out+2); /* temporary storage for vertices */
    std::vector<aiVector2D> temp_verts(max_out+2);

    // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
    if (!pMesh->mColors[0])
        pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
    else
        new(pMesh->mColors[0]) aiColor4D[pMesh->mNumVertices];

    aiColor4D* clr = pMesh->mColors[0];
#endif

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    FILE* fout = fopen(POLY_OUTPUT_FILE,"a");
#endif

    const aiVector3D* verts = pMesh->mVertices;

    // use std::unique_ptr to avoid slow std::vector<bool> specialiations
    std::unique_ptr<bool[]> done(new bool[max_out]);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];

        unsigned int* idx = face.mIndices;
        int num = (int)face.mNumIndices, ear = 0, tmp, prev = num-1, next = 0, max = num;

        // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            aiColor4D& c = clr[idx[i]];
            c.r = (i+1) / (float)max;
            c.b = 1.f - c.r;
        }
#endif

        aiFace* const last_face = curOut;

        // if it's a simple point,line or triangle: just copy it
        if( face.mNumIndices <= 3)
        {
            aiFace& nface = *curOut++;
            nface.mNumIndices = face.mNumIndices;
            nface.mIndices    = face.mIndices;

            face.mIndices = NULL;
            continue;
        }
        // optimized code for quadrilaterals
        else if ( face.mNumIndices == 4) {

            // quads can have at maximum one concave vertex. Determine
            // this vertex (if it exists) and start tri-fanning from
            // it.
            unsigned int start_vertex = 0;
            for (unsigned int i = 0; i < 4; ++i) {
                const aiVector3D& v0 = verts[face.mIndices[(i+3) % 4]];
                const aiVector3D& v1 = verts[face.mIndices[(i+2) % 4]];
                const aiVector3D& v2 = verts[face.mIndices[(i+1) % 4]];

                const aiVector3D& v = verts[face.mIndices[i]];

                aiVector3D left = (v0-v);
                aiVector3D diag = (v1-v);
                aiVector3D right = (v2-v);

                left.Normalize();
                diag.Normalize();
                right.Normalize();

                const float angle = std::acos(left*diag) + std::acos(right*diag);
                if (angle > AI_MATH_PI_F) {
                    // this is the concave point
                    start_vertex = i;
                    break;
                }
            }

            const unsigned int temp[] = {face.mIndices[0], face.mIndices[1], face.mIndices[2], face.mIndices[3]};

            aiFace& nface = *curOut++;
            nface.mNumIndices = 3;
            nface.mIndices = face.mIndices;

            nface.mIndices[0] = temp[start_vertex];
            nface.mIndices[1] = temp[(start_vertex + 1) % 4];
            nface.mIndices[2] = temp[(start_vertex + 2) % 4];

            aiFace& sface = *curOut++;
            sface.mNumIndices = 3;
            sface.mIndices = new unsigned int[3];

            sface.mIndices[0] = temp[start_vertex];
            sface.mIndices[1] = temp[(start_vertex + 2) % 4];
            sface.mIndices[2] = temp[(start_vertex + 3) % 4];

            // prevent double deletion of the indices field
            face.mIndices = NULL;
            continue;
        }
        else
        {
            // A polygon with more than 3 vertices can be either concave or convex.
            // Usually everything we're getting is convex and we could easily
            // triangulate by tri-fanning. However, LightWave is probably the only
            // modeling suite to make extensive use of highly concave, monster polygons ...
            // so we need to apply the full 'ear cutting' algorithm to get it right.

            // RERQUIREMENT: polygon is expected to be simple and *nearly* planar.
            // We project it onto a plane to get a 2d triangle.

            // Collect all vertices of of the polygon.
           for (tmp = 0; tmp < max; ++tmp) {
                temp_verts3d[tmp] = verts[idx[tmp]];
            }

            // Get newell normal of the polygon. Store it for future use if it's a polygon-only mesh
            aiVector3D n;
            NewellNormal<3,3,3>(n,max,&temp_verts3d.front().x,&temp_verts3d.front().y,&temp_verts3d.front().z);
            if (nor_out) {
                 for (tmp = 0; tmp < max; ++tmp)
                     nor_out[idx[tmp]] = n;
            }

            // Select largest normal coordinate to ignore for projection
            const float ax = (n.x>0 ? n.x : -n.x);
            const float ay = (n.y>0 ? n.y : -n.y);
            const float az = (n.z>0 ? n.z : -n.z);

            unsigned int ac = 0, bc = 1; /* no z coord. projection to xy */
            float inv = n.z;
            if (ax > ay) {
                if (ax > az) { /* no x coord. projection to yz */
                    ac = 1; bc = 2;
                    inv = n.x;
                }
            }
            else if (ay > az) { /* no y coord. projection to zy */
                ac = 2; bc = 0;
                inv = n.y;
            }

            // Swap projection axes to take the negated projection vector into account
            if (inv < 0.f) {
                std::swap(ac,bc);
            }

            for (tmp =0; tmp < max; ++tmp) {
                temp_verts[tmp].x = verts[idx[tmp]][ac];
                temp_verts[tmp].y = verts[idx[tmp]][bc];
                done[tmp] = false;
            }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
            // plot the plane onto which we mapped the polygon to a 2D ASCII pic
            aiVector2D bmin,bmax;
            ArrayBounds(&temp_verts[0],max,bmin,bmax);

            char grid[POLY_GRID_Y][POLY_GRID_X+POLY_GRID_XPAD];
            std::fill_n((char*)grid,POLY_GRID_Y*(POLY_GRID_X+POLY_GRID_XPAD),' ');

            for (int i =0; i < max; ++i) {
                const aiVector2D& v = (temp_verts[i] - bmin) / (bmax-bmin);
                const size_t x = static_cast<size_t>(v.x*(POLY_GRID_X-1)), y = static_cast<size_t>(v.y*(POLY_GRID_Y-1));
                char* loc = grid[y]+x;
                if (grid[y][x] != ' ') {
                    for(;*loc != ' '; ++loc);
                    *loc++ = '_';
                }
                *(loc+::ai_snprintf(loc, POLY_GRID_XPAD,"%i",i)) = ' ';
            }


            for(size_t y = 0; y < POLY_GRID_Y; ++y) {
                grid[y][POLY_GRID_X+POLY_GRID_XPAD-1] = '\0';
                fprintf(fout,"%s\n",grid[y]);
            }

            fprintf(fout,"\ntriangulation sequence: ");
#endif

            //
            // FIXME: currently this is the slow O(kn) variant with a worst case
            // complexity of O(n^2) (I think). Can be done in O(n).
            while (num > 3) {

                // Find the next ear of the polygon
                int num_found = 0;
                for (ear = next;;prev = ear,ear = next) {

                    // break after we looped two times without a positive match
                    for (next=ear+1;done[(next>=max?next=0:next)];++next);
                    if (next < ear) {
                        if (++num_found == 2) {
                            break;
                        }
                    }
                    const aiVector2D* pnt1 = &temp_verts[ear],
                        *pnt0 = &temp_verts[prev],
                        *pnt2 = &temp_verts[next];

                    // Must be a convex point. Assuming ccw winding, it must be on the right of the line between p-1 and p+1.
                    if (OnLeftSideOfLine2D(*pnt0,*pnt2,*pnt1)) {
                        continue;
                    }

                    // and no other point may be contained in this triangle
                    for ( tmp = 0; tmp < max; ++tmp) {

                        // We need to compare the actual values because it's possible that multiple indexes in
                        // the polygon are referring to the same position. concave_polygon.obj is a sample
                        //
                        // FIXME: Use 'epsiloned' comparisons instead? Due to numeric inaccuracies in
                        // PointInTriangle() I'm guessing that it's actually possible to construct
                        // input data that would cause us to end up with no ears. The problem is,
                        // which epsilon? If we chose a too large value, we'd get wrong results
                        const aiVector2D& vtmp = temp_verts[tmp];
                        if ( vtmp != *pnt1 && vtmp != *pnt2 && vtmp != *pnt0 && PointInTriangle2D(*pnt0,*pnt1,*pnt2,vtmp)) {
                            break;
                        }
                    }
                    if (tmp != max) {
                        continue;
                    }

                    // this vertex is an ear
                    break;
                }
                if (num_found == 2) {

                    // Due to the 'two ear theorem', every simple polygon with more than three points must
                    // have 2 'ears'. Here's definitely something wrong ... but we don't give up yet.
                    //

                    // Instead we're continuing with the standard tri-fanning algorithm which we'd
                    // use if we had only convex polygons. That's life.
                    ASSIMP_LOG_ERROR("Failed to triangulate polygon (no ear found). Probably not a simple polygon?");

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
                    fprintf(fout,"critical error here, no ear found! ");
#endif
                    num = 0;
                    break;

                    curOut -= (max-num); /* undo all previous work */
                    for (tmp = 0; tmp < max-2; ++tmp) {
                        aiFace& nface = *curOut++;

                        nface.mNumIndices = 3;
                        if (!nface.mIndices)
                            nface.mIndices = new unsigned int[3];

                        nface.mIndices[0] = 0;
                        nface.mIndices[1] = tmp+1;
                        nface.mIndices[2] = tmp+2;

                    }
                    num = 0;
                    break;
                }

                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;

                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                // setup indices for the new triangle ...
                nface.mIndices[0] = prev;
                nface.mIndices[1] = ear;
                nface.mIndices[2] = next;

                // exclude the ear from most further processing
                done[ear] = true;
                --num;
            }
            if (num > 0) {
                // We have three indices forming the last 'ear' remaining. Collect them.
                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;
                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                for (tmp = 0; done[tmp]; ++tmp);
                nface.mIndices[0] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[1] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[2] = tmp;

            }
        }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS

        for(aiFace* f = last_face; f != curOut; ++f) {
            unsigned int* i = f->mIndices;
            fprintf(fout," (%i %i %i)",i[0],i[1],i[2]);
        }

        fprintf(fout,"\n*********************************************************************\n");
        fflush(fout);

#endif

        for(aiFace* f = last_face; f != curOut; ) {
            unsigned int* i = f->mIndices;

            //  drop dumb 0-area triangles - deactivated for now:
            //FindDegenerates post processing step can do the same thing
            //if (std::fabs(GetArea2D(temp_verts[i[0]],temp_verts[i[1]],temp_verts[i[2]])) < 1e-5f) {
            //    ASSIMP_LOG_DEBUG("Dropping triangle with area 0");
            //    --curOut;

            //    delete[] f->mIndices;
            //    f->mIndices = nullptr;

            //    for(aiFace* ff = f; ff != curOut; ++ff) {
            //        ff->mNumIndices = (ff+1)->mNumIndices;
            //        ff->mIndices = (ff+1)->mIndices;
            //        (ff+1)->mIndices = nullptr;
            //    }
            //    continue;
            //}

            i[0] = idx[i[0]];
            i[1] = idx[i[1]];
            i[2] = idx[i[2]];
            ++f;
        }

        delete[] face.mIndices;
        face.mIndices = NULL;
    }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    fclose(fout);
#endif

    // kill the old faces
    delete [] pMesh->mFaces;

    // ... and store the new ones
    pMesh->mFaces    = out;
    pMesh->mNumFaces = (unsigned int)(curOut-out); /* not necessarily equal to numOut */
    return true;
}